

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utVersion.cpp
# Opt level: O0

void __thiscall
utVersion_aiGetVersionRevisionTest_Test::TestBody(utVersion_aiGetVersionRevisionTest_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_48;
  Message local_40 [3];
  uint local_28;
  uint local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  utVersion_aiGetVersionRevisionTest_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_24 = aiGetVersionRevision();
  local_28 = 0;
  testing::internal::CmpHelperNE<unsigned_int,unsigned_int>
            ((internal *)local_20,"aiGetVersionRevision()","0U",&local_24,&local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utVersion.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST_F( utVersion, aiGetVersionRevisionTest ) {
    EXPECT_NE( aiGetVersionRevision(), 0U );
}